

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O0

put_transaction<void>_conflict * __thiscall
density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
start_dyn_push_move(put_transaction<void>_conflict *__return_storage_ptr__,
                   heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *this,runtime_type<> *i_type,void *i_source)

{
  size_t i_size;
  size_t i_alignment;
  put_transaction<void> local_70;
  runtime_type<> *local_48;
  runtime_type<> *type_storage;
  runtime_type<> *type;
  Allocation push_data;
  void *i_source_local;
  runtime_type<> *i_type_local;
  heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *this_local;
  
  push_data.m_user_storage = i_source;
  i_size = runtime_type<>::size(i_type);
  i_alignment = runtime_type<>::alignment(i_type);
  _type = heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
          inplace_allocate<0ul,true>
                    ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                      *)this,i_size,i_alignment);
  type_storage = (runtime_type<> *)0x0;
  local_48 = type_after_control((ControlBlock *)type);
  local_48->m_feature_table = i_type->m_feature_table;
  type_storage = local_48;
  runtime_type<>::move_construct(i_type,push_data.m_control_block,push_data.m_user_storage);
  put_transaction<void>::put_transaction(&local_70,0,this,_type);
  heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  put_transaction<void>::put_transaction<void,void>
            ((put_transaction<void> *)__return_storage_ptr__,&local_70);
  put_transaction<void>::~put_transaction(&local_70);
  return __return_storage_ptr__;
}

Assistant:

put_transaction<> start_dyn_push_move(const RUNTIME_TYPE & i_type, void * i_source)
        {
            auto push_data = inplace_allocate<0, true>(i_type.size(), i_type.alignment());

            RUNTIME_TYPE * type = nullptr;
            try
            {
                auto const type_storage = type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) RUNTIME_TYPE(i_type);

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                i_type.move_construct(push_data.m_user_storage, i_source);
            }
            catch (...)
            {
                if (type != nullptr)
                    type->RUNTIME_TYPE::~RUNTIME_TYPE();
                DENSITY_ASSERT_INTERNAL(
                  (push_data.m_control_block->m_next & (detail::Queue_Busy | detail::Queue_Dead)) ==
                  0);
                push_data.m_control_block->m_next += detail::Queue_Dead;
                throw;
            }

            return put_transaction<void>(PrivateType(), this, push_data);
        }